

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000031d1f0 = 0x2e2e2e2e2e2e2e;
    uRam000000000031d1f7._0_1_ = '.';
    uRam000000000031d1f7._1_1_ = '.';
    uRam000000000031d1f7._2_1_ = '.';
    uRam000000000031d1f7._3_1_ = '.';
    uRam000000000031d1f7._4_1_ = '.';
    uRam000000000031d1f7._5_1_ = '.';
    uRam000000000031d1f7._6_1_ = '.';
    uRam000000000031d1f7._7_1_ = '.';
    DAT_0031d1e0 = '.';
    DAT_0031d1e0_1._0_1_ = '.';
    DAT_0031d1e0_1._1_1_ = '.';
    DAT_0031d1e0_1._2_1_ = '.';
    DAT_0031d1e0_1._3_1_ = '.';
    DAT_0031d1e0_1._4_1_ = '.';
    DAT_0031d1e0_1._5_1_ = '.';
    DAT_0031d1e0_1._6_1_ = '.';
    uRam000000000031d1e8 = 0x2e2e2e2e2e2e2e;
    DAT_0031d1ef = 0x2e;
    DAT_0031d1d0 = '.';
    DAT_0031d1d0_1._0_1_ = '.';
    DAT_0031d1d0_1._1_1_ = '.';
    DAT_0031d1d0_1._2_1_ = '.';
    DAT_0031d1d0_1._3_1_ = '.';
    DAT_0031d1d0_1._4_1_ = '.';
    DAT_0031d1d0_1._5_1_ = '.';
    DAT_0031d1d0_1._6_1_ = '.';
    uRam000000000031d1d8._0_1_ = '.';
    uRam000000000031d1d8._1_1_ = '.';
    uRam000000000031d1d8._2_1_ = '.';
    uRam000000000031d1d8._3_1_ = '.';
    uRam000000000031d1d8._4_1_ = '.';
    uRam000000000031d1d8._5_1_ = '.';
    uRam000000000031d1d8._6_1_ = '.';
    uRam000000000031d1d8._7_1_ = '.';
    DAT_0031d1c0 = '.';
    DAT_0031d1c0_1._0_1_ = '.';
    DAT_0031d1c0_1._1_1_ = '.';
    DAT_0031d1c0_1._2_1_ = '.';
    DAT_0031d1c0_1._3_1_ = '.';
    DAT_0031d1c0_1._4_1_ = '.';
    DAT_0031d1c0_1._5_1_ = '.';
    DAT_0031d1c0_1._6_1_ = '.';
    uRam000000000031d1c8._0_1_ = '.';
    uRam000000000031d1c8._1_1_ = '.';
    uRam000000000031d1c8._2_1_ = '.';
    uRam000000000031d1c8._3_1_ = '.';
    uRam000000000031d1c8._4_1_ = '.';
    uRam000000000031d1c8._5_1_ = '.';
    uRam000000000031d1c8._6_1_ = '.';
    uRam000000000031d1c8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000031d1b8._0_1_ = '.';
    uRam000000000031d1b8._1_1_ = '.';
    uRam000000000031d1b8._2_1_ = '.';
    uRam000000000031d1b8._3_1_ = '.';
    uRam000000000031d1b8._4_1_ = '.';
    uRam000000000031d1b8._5_1_ = '.';
    uRam000000000031d1b8._6_1_ = '.';
    uRam000000000031d1b8._7_1_ = '.';
    DAT_0031d1ff = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}